

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon.c
# Opt level: O1

void JPCommon_make_label(JPCommon *jpcommon)

{
  int acc;
  int chain_flag;
  JPCommonLabel *pJVar1;
  char *pron;
  char *pos;
  char *ctype;
  char *cform;
  JPCommonNode *node;
  
  if (jpcommon->label == (JPCommonLabel *)0x0) {
    pJVar1 = (JPCommonLabel *)calloc(1,0x68);
    jpcommon->label = pJVar1;
  }
  else {
    JPCommonLabel_clear(jpcommon->label);
  }
  JPCommonLabel_initialize(jpcommon->label);
  for (node = jpcommon->head; node != (JPCommonNode *)0x0; node = node->next) {
    pJVar1 = jpcommon->label;
    pron = JPCommonNode_get_pron(node);
    pos = JPCommonNode_get_pos(node);
    ctype = JPCommonNode_get_ctype(node);
    cform = JPCommonNode_get_cform(node);
    acc = JPCommonNode_get_acc(node);
    chain_flag = JPCommonNode_get_chain_flag(node);
    JPCommonLabel_push_word(pJVar1,pron,pos,ctype,cform,acc,chain_flag);
  }
  JPCommonLabel_make(jpcommon->label);
  return;
}

Assistant:

void JPCommon_make_label(JPCommon * jpcommon)
{
   JPCommonNode *node = jpcommon->head;

   /* initialize */
   if (jpcommon->label != NULL)
      JPCommonLabel_clear(jpcommon->label);
   else
      jpcommon->label = (JPCommonLabel *) calloc(1, sizeof(JPCommonLabel));
   JPCommonLabel_initialize(jpcommon->label);
   /* push word */
   for (node = jpcommon->head; node != NULL; node = node->next)
      JPCommonLabel_push_word(jpcommon->label, JPCommonNode_get_pron(node),
                              JPCommonNode_get_pos(node),
                              JPCommonNode_get_ctype(node),
                              JPCommonNode_get_cform(node),
                              JPCommonNode_get_acc(node), JPCommonNode_get_chain_flag(node));
   /* make label */
   JPCommonLabel_make(jpcommon->label);
}